

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

bool __thiscall
matchit::impl::Id<mathiu::impl::Product>::matchValue<mathiu::impl::Product_const&>
          (Id<mathiu::impl::Product> *this,Product *v)

{
  bool bVar1;
  ExprPtrMap *l;
  BlockT *pBVar2;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    l = &internalValue(this)->super_ExprPtrMap;
    bVar1 = mathiu::impl::operator==(l,&v->super_ExprPtrMap);
    return bVar1;
  }
  pBVar2 = block(this);
  IdUtil<mathiu::impl::Product>::bindValue<mathiu::impl::Product_const&>
            (&(pBVar2->super_IdBlockBase<mathiu::impl::Product>).mVariant,v);
  return true;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }